

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AngleR.cpp
# Opt level: O3

void __thiscall
OpenMD::AngleR::AngleR
          (AngleR *this,SimInfo *info,string *filename,string *sele1,string *sele2,RealType len,
          int nrbins)

{
  string *psVar1;
  pointer pcVar2;
  long *plVar3;
  ostream *this_00;
  OpenMDBitSet *pOVar4;
  long lVar5;
  string paramString;
  stringstream params;
  string local_228;
  SelectionEvaluator *local_208;
  SelectionEvaluator *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  vector<double,_std::allocator<double>_> *local_1e8;
  vector<int,_std::allocator<int>_> *local_1e0;
  SelectionManager *local_1d8;
  SelectionManager *local_1d0;
  string *local_1c8;
  string *local_1c0;
  undefined1 local_1b8 [16];
  OpenMDBitSet local_1a8 [2];
  ios_base local_138 [264];
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nrbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__AngleR_00335cd0;
  this->doVect_ = false;
  this->doOffset_ = false;
  local_1c0 = &this->selectionScript1_;
  local_1f0 = &(this->selectionScript1_).field_2;
  (this->selectionScript1_)._M_dataplus._M_p = (pointer)local_1f0;
  pcVar2 = (sele1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c0,pcVar2,pcVar2 + sele1->_M_string_length);
  local_1c8 = &this->selectionScript2_;
  local_1f8 = &(this->selectionScript2_).field_2;
  (this->selectionScript2_)._M_dataplus._M_p = (pointer)local_1f8;
  pcVar2 = (sele2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,pcVar2,pcVar2 + sele2->_M_string_length);
  local_1d0 = &this->seleMan1_;
  SelectionManager::SelectionManager(local_1d0,info);
  local_1d8 = &this->seleMan2_;
  SelectionManager::SelectionManager(local_1d8,info);
  local_200 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(local_200,info);
  local_208 = &this->evaluator2_;
  SelectionEvaluator::SelectionEvaluator(local_208,info);
  this->len_ = len;
  this->nRBins_ = nrbins;
  local_1e8 = &this->avgAngleR_;
  local_1e0 = &this->count_;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->avgAngleR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->avgAngleR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->avgAngleR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  getPrefix(&local_228,filename);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_228);
  pOVar4 = (OpenMDBitSet *)(plVar3 + 2);
  if ((OpenMDBitSet *)*plVar3 == pOVar4) {
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p =
         (pOVar4->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._8_8_ = plVar3[3];
    local_1b8._0_8_ = local_1a8;
  }
  else {
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p =
         (pOVar4->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_1b8._0_8_ = (OpenMDBitSet *)*plVar3;
  }
  local_1b8._8_8_ = plVar3[1];
  *plVar3 = (long)pOVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  psVar1 = &(this->super_StaticAnalyser).outputFilename_;
  std::__cxx11::string::_M_assign((string *)psVar1);
  if ((OpenMDBitSet *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)
                                    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  SelectionEvaluator::loadScriptString(local_200,sele1);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_1b8,local_200);
    lVar5 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan1_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar5),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_1b8._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar5));
      lVar5 = lVar5 + 0x28;
    } while (lVar5 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_1b8);
  }
  SelectionEvaluator::loadScriptString(local_208,sele2);
  if ((this->evaluator2_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_1b8,local_208);
    lVar5 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan2_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar5),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_1b8._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar5));
      lVar5 = lVar5 + 0x28;
    } while (lVar5 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_1b8);
  }
  this->deltaR_ = this->len_ / (double)this->nRBins_;
  std::vector<double,_std::allocator<double>_>::resize(&this->histogram_,(long)this->nRBins_);
  std::vector<int,_std::allocator<int>_>::resize(local_1e0,(long)this->nRBins_);
  std::vector<double,_std::allocator<double>_>::resize(local_1e8,(long)this->nRBins_);
  local_1b8._0_8_ = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,"radial density function Angle(r)","");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).analysisType_);
  if ((OpenMDBitSet *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)
                                    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  getPrefix(&local_228,filename);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_228);
  pOVar4 = (OpenMDBitSet *)(plVar3 + 2);
  if ((OpenMDBitSet *)*plVar3 == pOVar4) {
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p =
         (pOVar4->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._8_8_ = plVar3[3];
    local_1b8._0_8_ = local_1a8;
  }
  else {
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p =
         (pOVar4->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_1b8._0_8_ = (OpenMDBitSet *)*plVar3;
  }
  local_1b8._8_8_ = plVar3[1];
  *plVar3 = (long)pOVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)psVar1);
  if ((OpenMDBitSet *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)
                                    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," len = ",7);
  this_00 = std::ostream::_M_insert<double>(this->len_);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,", nrbins = ",0xb);
  std::ostream::operator<<((ostream *)this_00,this->nRBins_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).paramString_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

AngleR::AngleR(SimInfo* info, const std::string& filename,
                 const std::string& sele1, const std::string& sele2,
                 RealType len, int nrbins) :
      StaticAnalyser(info, filename, nrbins),
      doVect_(false), doOffset_(false), selectionScript1_(sele1),
      selectionScript2_(sele2), seleMan1_(info), seleMan2_(info),
      evaluator1_(info), evaluator2_(info), len_(len), nRBins_(nrbins) {
    setOutputName(getPrefix(filename) + ".AngleR");

    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    evaluator2_.loadScriptString(sele2);
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }

    deltaR_ = len_ / nRBins_;

    histogram_.resize(nRBins_);
    count_.resize(nRBins_);
    avgAngleR_.resize(nRBins_);

    setAnalysisType("radial density function Angle(r)");
    setOutputName(getPrefix(filename) + ".AngleR");
    std::stringstream params;
    params << " len = " << len_ << ", nrbins = " << nRBins_;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }